

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdExtractEcdsaAdaptorSecret
              (void *handle,char *adaptor_signature,char *signature,char *adaptor,
              char **adaptor_secret)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  Privkey secret;
  int result;
  string *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  CfdError error_code;
  allocator *paVar5;
  CfdException *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd70;
  string local_248;
  allocator local_221;
  string local_220;
  Pubkey local_200;
  allocator local_1e1;
  string local_1e0;
  ByteData local_1c0;
  allocator local_1a1;
  string local_1a0;
  AdaptorSignature local_180;
  Privkey local_168;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  CfdSourceLocation local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  undefined4 local_34;
  undefined8 *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  local_34 = 0xffffffff;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x13d;
    local_60.funcname = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::warn<>(&local_60,"adaptor_signature is null or empty.");
    local_82 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,"Failed to parameter. adaptor_signature is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd30,error_code,in_stack_fffffffffffffd20);
    local_82 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x143;
    local_a0.funcname = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::warn<>(&local_a0,"signature is null or empty.");
    local_c2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"Failed to parameter. signature is null or empty.",&local_c1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd30,error_code,in_stack_fffffffffffffd20);
    local_c2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar2 = cfd::capi::IsEmptyString(local_28);
  if ((bool)uVar2) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x149;
    local_e0.funcname = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::warn<>(&local_e0,"adaptor is null or empty.");
    local_102 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"Failed to parameter. adaptor is null or empty.",&local_101);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd30,error_code,in_stack_fffffffffffffd20);
    local_102 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_30 == (undefined8 *)0x0) {
    local_120.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_120.filename = local_120.filename + 1;
    local_120.line = 0x14f;
    local_120.funcname = "CfdExtractEcdsaAdaptorSecret";
    cfd::core::logger::warn<>(&local_120,"adaptor_secret is null.");
    local_142 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_140,"Failed to parameter. adaptor_secret is null.",&local_141);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd30,error_code,in_stack_fffffffffffffd20);
    local_142 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,local_18,&local_1a1);
  cfd::core::AdaptorSignature::AdaptorSignature(&local_180,&local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,local_20,&local_1e1);
  cfd::core::ByteData::ByteData(&local_1c0,&local_1e0);
  paVar5 = &local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,local_28,paVar5);
  cfd::core::Pubkey::Pubkey(&local_200,&local_220);
  cfd::core::AdaptorUtil::ExtractSecret(&local_168,&local_180,&local_1c0,&local_200);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x5ccd1c);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  cfd::core::ByteData::~ByteData((ByteData *)0x5ccd43);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  cfd::core::AdaptorSignature::~AdaptorSignature((AdaptorSignature *)0x5ccd6a);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_248,&local_168);
  pcVar4 = cfd::capi::CreateString((string *)CONCAT17(uVar2,in_stack_fffffffffffffd70));
  *local_30 = pcVar4;
  std::__cxx11::string::~string((string *)&local_248);
  local_4 = 0;
  cfd::core::Privkey::~Privkey((Privkey *)0x5ccde4);
  return local_4;
}

Assistant:

int CfdExtractEcdsaAdaptorSecret(
    void* handle, const char* adaptor_signature, const char* signature,
    const char* adaptor, char** adaptor_secret) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(adaptor_signature)) {
      warn(CFD_LOG_SOURCE, "adaptor_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_signature is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(adaptor)) {
      warn(CFD_LOG_SOURCE, "adaptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor is null or empty.");
    }
    if (adaptor_secret == nullptr) {
      warn(CFD_LOG_SOURCE, "adaptor_secret is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_secret is null.");
    }

    Privkey secret = AdaptorUtil::ExtractSecret(
        AdaptorSignature(adaptor_signature), ByteData(signature),
        Pubkey(adaptor));

    *adaptor_secret = CreateString(secret.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}